

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int GetLatestDataHokuyo(HOKUYO *pHokuyo,double *pDistances,double *pAngles)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int local_203c;
  char databuf [8192];
  
  memset(databuf,0,0x2000);
  local_203c = 0;
  iVar1 = GetLatestHokuyoMessageHokuyo(pHokuyo,databuf,0x2000,&local_203c);
  if (iVar1 == 0) {
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < local_203c; lVar3 = lVar3 + 3) {
      pAngles[lVar2] =
           ((double)(((pHokuyo->SlitDivision / 2 + pHokuyo->StartingStep) - pHokuyo->FrontStep) +
                    (int)lVar2) * pHokuyo->StepAngleSize * 3.141592653589793) / 180.0 +
           -3.141592653589793;
      iVar1 = CharacterDecodingHokuyo(databuf + lVar3,3);
      pDistances[lVar2] = (double)iVar1 / 1000.0;
      lVar2 = lVar2 + 1;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetLatestDataHokuyo(HOKUYO* pHokuyo, double* pDistances, double* pAngles)
{
	char databuf[MAX_NB_BYTES_HOKUYO];
	int nbdatabytes = 0;
	int i = 0, k = 0;

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestHokuyoMessageHokuyo(pHokuyo, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	//memset(pHokuyoData, 0, sizeof(HokuyoDATA));
	
	// Note : the scanner rotates in an anti-clockwise direction when viewed from top.

	// 20-5600 mm, 682 pings...
	
	k = 0;
	for (i = 0; i < nbdatabytes; i += 3)
	{
		pAngles[k] = (k+pHokuyo->StartingStep-pHokuyo->FrontStep+pHokuyo->SlitDivision/2)*pHokuyo->StepAngleSize*M_PI/180.0-M_PI;
		pDistances[k] = CharacterDecodingHokuyo(databuf+i, 3)/1000.0;
		k++;
	}


	// File for data : tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);


	//pHokuyo->LastHokuyoData = *pHokuyoData;

	return EXIT_SUCCESS;
}